

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

double __thiscall tcu::FloatFormat::ulp(FloatFormat *this,double x,double count)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  int local_24;
  double local_20;
  double local_18;
  ScopedRoundingMode ctx;
  
  local_24 = 0;
  uVar2 = -(ulong)(-x <= x);
  local_18 = count;
  dVar3 = deFractExp((double)((ulong)x & uVar2 | ~uVar2 & (ulong)-x),&local_24);
  if (NAN(dVar3)) {
    local_20 = NAN;
  }
  else if (dVar3 < -1.79769313486232e+308 == dVar3 <= 1.79769313486232e+308) {
    local_20 = ldexp(1.0,this->m_maxExp - this->m_fractionBits);
  }
  else {
    if ((dVar3 != 1.0) || (NAN(dVar3))) {
      if ((dVar3 == 0.0) && (!NAN(dVar3))) {
        local_24 = this->m_minExp;
      }
    }
    else {
      local_24 = local_24 + -1;
    }
    iVar1 = this->m_minExp;
    if (this->m_minExp < local_24) {
      iVar1 = local_24;
    }
    local_24 = iVar1;
    local_20 = ldexp(1.0,iVar1 - this->m_fractionBits);
    ScopedRoundingMode::ScopedRoundingMode(&ctx,DE_ROUNDINGMODE_TO_POSITIVE_INF);
    local_20 = local_20 * local_18;
    ScopedRoundingMode::~ScopedRoundingMode(&ctx);
  }
  return local_20;
}

Assistant:

double FloatFormat::ulp (double x, double count) const
{
	int				exp		= 0;
	const double	frac	= deFractExp(deAbs(x), &exp);

	if (deIsNaN(frac))
		return TCU_NAN;
	else if (deIsInf(frac))
		return deLdExp(1.0, m_maxExp - m_fractionBits);
	else if (frac == 1.0)
	{
		// Harrison's ULP: choose distance to closest (i.e. next lower) at binade
		// boundary.
		--exp;
	}
	else if (frac == 0.0)
		exp = m_minExp;

	// ULP cannot be lower than the smallest quantum.
	exp = de::max(exp, m_minExp);

	{
		const double		oneULP	= deLdExp(1.0, exp - m_fractionBits);
		ScopedRoundingMode	ctx		(DE_ROUNDINGMODE_TO_POSITIVE_INF);

		return oneULP * count;
	}
}